

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

bool __thiscall gimage::TIFFImageIO::handlesFile(TIFFImageIO *this,char *name,bool reading)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte in_DL;
  char *in_RSI;
  string s;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < 5) {
    local_1 = 0;
  }
  else {
    lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aead1);
    lVar3 = std::__cxx11::string::size();
    if (lVar2 != lVar3 + -4) {
      lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aee74);
      lVar3 = std::__cxx11::string::size();
      if (lVar2 != lVar3 + -4) {
        lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aee79);
        lVar3 = std::__cxx11::string::size();
        if (lVar2 != lVar3 + -5) {
          lVar2 = std::__cxx11::string::rfind((char *)local_40,0x1aee7f);
          lVar3 = std::__cxx11::string::size();
          if (lVar2 != lVar3 + -5) {
            local_1 = 0;
            goto LAB_0018f20a;
          }
        }
      }
    }
    local_1 = 1;
  }
LAB_0018f20a:
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool TIFFImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() < 5)
  {
    return false;
  }

  if (s.rfind(".tif") == s.size()-4 || s.rfind(".TIF") == s.size()-4 ||
    s.rfind(".tiff") == s.size()-5 || s.rfind(".TIFF") == s.size()-5)
  {
    return true;
  }

  return false;
}